

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.inl
# Opt level: O3

buffer_reader * operator>>(buffer_reader *reader,external_distance_sensor_message *message)

{
  ssize_t sVar1;
  ssize_t sVar2;
  ostream *poVar3;
  runtime_error *this;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  message_header *header_00;
  size_t i;
  long lVar4;
  message_header header;
  stringstream stream;
  message_header local_1d5;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  undefined1 local_1a0 [376];
  
  sVar1 = buffer_reader::read(reader,(int)message,in_RDX,in_RCX);
  header_00 = &local_1d5;
  operator>>(reader,header_00);
  if (local_1d5.id == EXTERNAL_DISTANCE_SENSOR) {
    lVar4 = 0;
    do {
      buffer_reader::operator>>(reader,(uint8_t *)((long)(message->data)._M_elems + lVar4));
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x48);
    return reader;
  }
  sVar2 = buffer_reader::read(reader,(int)header_00,__buf,in_RCX);
  buffer_reader::unwind(reader,sVar2 - sVar1);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Message ids do not match",0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," (",2);
  *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) =
       *(uint *)(*(_func_int **)(local_1a0._0_8_ + -0x18) + (long)(local_1a0 + 0x18)) & 0xffffffb5 |
       8;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,(uint)local_1d5.id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," instead of ",0xc);
  *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar3->field_0x18 + (long)poVar3->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x42);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline buffer_reader& operator>>(buffer_reader& reader, T& message)
{
    std::size_t read = reader.read();
    message_header header;
    reader >> header;

    if(header.id != message.id())
    {
        reader.unwind(reader.read() - read);
        std::stringstream stream;
        stream << "Message ids do not match"
               << " (" << std::hex << static_cast<int>(header.id) << " instead of " << std::hex << static_cast<int>(message.id()) << ")";

        throw std::runtime_error(stream.str());
    }

    message.read_body(reader);

    return reader;
}